

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

bool __thiscall
Object_Key_Store_Data::operator==(Object_Key_Store_Data *this,Am_Wrapper *test_value)

{
  uint uVar1;
  uint uVar2;
  bool local_31;
  Am_Wrapper *test_value_local;
  Object_Key_Store_Data *this_local;
  
  uVar1 = (uint)id;
  uVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
  if (uVar1 == (uVar2 & 0xffff)) {
    local_31 = true;
    if ((Object_Key_Store_Data *)test_value != this) {
      local_31 = operator==((Object_Key_Store_Data *)test_value,this);
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

static Am_Value
from_object_procedure(Am_Object & /*self*/)
{
  Am_Value value;
  Object_Key_Store_Data *store =
      (Object_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = (store->object).Get(store->key);
  store->Release();
  return value;
}